

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O1

size_t arangodb::velocypack::anon_unknown_0::JSONStringCopyC(uint8_t *dst,uint8_t *src,size_t limit)

{
  byte *pbVar1;
  byte bVar2;
  
  pbVar1 = src + limit;
  if (0 < (long)limit) {
    do {
      bVar2 = *src;
      if (((bVar2 < 0x20) || (bVar2 == 0x22)) || (bVar2 == 0x5c)) break;
      src = src + 1;
      *dst = bVar2;
      dst = dst + 1;
    } while (src < pbVar1);
  }
  return (size_t)(src + (limit - (long)pbVar1));
}

Assistant:

inline std::size_t JSONStringCopyC(uint8_t* dst, uint8_t const* src,
                                   std::size_t limit) {
  // Copy up to limit uint8_t from src to dst.
  // Stop at the first control character or backslash or double quote.
  // Report the number of bytes copied. May copy less bytes, for example
  // for alignment reasons.
  uint8_t const* end = src + limit;
  while (src < end && *src >= 32 && *src != '\\' && *src != '"') {
    *dst++ = *src++;
  }
  return limit - (end - src);
}